

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

InsideExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::InsideExpression,slang::ast::Type_const&,slang::ast::Expression_const&,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange>
          (BumpAllocator *this,Type *args,Expression *args_1,
          span<const_slang::ast::Expression_*,_18446744073709551615UL> *args_2,SourceRange *args_3)

{
  pointer ppEVar1;
  size_type sVar2;
  SourceLocation SVar3;
  SourceLocation SVar4;
  InsideExpression *pIVar5;
  
  pIVar5 = (InsideExpression *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((InsideExpression *)this->endPtr < pIVar5 + 1) {
    pIVar5 = (InsideExpression *)allocateSlow(this,0x48,8);
  }
  else {
    this->head->current = (byte *)(pIVar5 + 1);
  }
  ppEVar1 = args_2->data_;
  sVar2 = args_2->size_;
  SVar3 = args_3->startLoc;
  SVar4 = args_3->endLoc;
  (pIVar5->super_Expression).kind = Inside;
  (pIVar5->super_Expression).type.ptr = args;
  (pIVar5->super_Expression).constant = (ConstantValue *)0x0;
  (pIVar5->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pIVar5->super_Expression).sourceRange.startLoc = SVar3;
  (pIVar5->super_Expression).sourceRange.endLoc = SVar4;
  pIVar5->left_ = args_1;
  (pIVar5->rangeList_).data_ = ppEVar1;
  (pIVar5->rangeList_).size_ = sVar2;
  return pIVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }